

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O2

void __thiscall
ezc3d::c3d::frames(c3d *this,
                  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *frames,
                  size_t firstFrameidx)

{
  pointer pFVar1;
  ulong uVar2;
  size_t idx;
  size_t i;
  ulong uVar3;
  long lVar4;
  
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    pFVar1 = (frames->
             super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar2 = ((long)(frames->
                   super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 0x30;
    if (uVar2 <= uVar3) break;
    idx = firstFrameidx + uVar3;
    if (firstFrameidx == 0xffffffffffffffff) {
      idx = 0xffffffffffffffff;
    }
    frame(this,(Frame *)((long)&(pFVar1->_points).
                                super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr + lVar4),idx,uVar3 < uVar2 - 1 && uVar3 != 0);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x30;
  }
  return;
}

Assistant:

void ezc3d::c3d::frames(const std::vector<ezc3d::DataNS::Frame> frames,
                        size_t firstFrameidx) {

  for (size_t i = 0; i < frames.size(); i++) {
    // Only performs internal updates on the first and last frames
    bool skipInternalUpdates = i > 0 && i < frames.size() - 1;
    frame(frames[i], firstFrameidx == SIZE_MAX ? SIZE_MAX : firstFrameidx + i,
          skipInternalUpdates);
  }
}